

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall
md::Code::or_to_dx(Code *this,Param *param,DataRegister *reg,Size size,bool param_minus_reg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  uVar4 = 0x40;
  if (size != WORD) {
    uVar4 = (uint)(size == LONG) << 7;
  }
  iVar1 = (**(reg->super_Register).super_Param._vptr_Param)(reg);
  iVar2 = (*param->_vptr_Param[1])(param);
  iVar3 = (**param->_vptr_Param)(param);
  iVar1 = iVar3 + ((uint)param_minus_reg << 8 | iVar1 << 9 | uVar4) + iVar2 * 8 + -0x8000;
  local_40 = (uchar)((uint)iVar1 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar1;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*param->_vptr_Param[2])(&local_40,param);
  puVar5 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar5 != local_38) {
    do {
      local_41 = *puVar5;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_38);
    puVar5 = (uchar *)CONCAT71(uStack_3f,local_40);
  }
  if (puVar5 != (uchar *)0x0) {
    operator_delete(puVar5,local_30 - (long)puVar5);
  }
  return this;
}

Assistant:

Code& Code::or_to_dx(const Param& param, const DataRegister& reg, Size size, bool param_minus_reg)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t param_minus_reg_mask = ((param_minus_reg) ? 1 : 0) << 8;

    uint16_t opcode = 0x8000 + (reg.getXn() << 9) + param_minus_reg_mask + (size_code << 6) + param.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(param.getAdditionnalData());

    return *this;
}